

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float __thiscall
tcu::Texture1DArrayView::sampleCompareOffset
          (Texture1DArrayView *this,Sampler *sampler,float ref,float s,float t,float lod,
          deInt32 offset)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  float fVar1;
  IVec2 local_28;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  local_28.m_data[1] = selectLayer(this,t);
  local_28.m_data[0] = offset;
  fVar1 = sampleLevelArray1DCompare(levels,numLevels,sampler,ref,s,lod,&local_28);
  return fVar1;
}

Assistant:

float Texture1DArrayView::sampleCompareOffset (const Sampler& sampler, float ref, float s, float t, float lod, deInt32 offset) const
{
	return sampleLevelArray1DCompare(m_levels, m_numLevels, sampler, ref, s, lod, IVec2(offset, selectLayer(t)));
}